

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O2

void __thiscall cmUVJobServerClient::Impl::ReceivedToken(Impl *this)

{
  DecrementNeedTokens(this);
  HoldToken(this);
  return;
}

Assistant:

void cmUVJobServerClient::Impl::ReceivedToken()
{
  this->DecrementNeedTokens();
  this->HoldToken();
}